

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O3

void anon_unknown.dwarf_2c92::ndiTXHelper(ndicapi *pol,char *command,char *commandReply)

{
  char *pcVar1;
  char (*pacVar2) [52];
  char (*pacVar3) [24];
  uint uVar4;
  int iVar5;
  int i;
  uint uVar6;
  char *pcVar7;
  char *pcVar8;
  char cVar9;
  char cVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  char *pcVar15;
  uint uVar16;
  char (*pacVar17) [24];
  byte bVar18;
  char (*pacVar19) [52];
  bool bVar20;
  
  uVar4 = 1;
  if (command[2] == ' ') {
    cVar10 = command[3];
  }
  else {
    if (command[2] != ':') goto LAB_00107d7e;
    cVar10 = command[7];
  }
  if (cVar10 != '\r') {
    lVar13 = 0;
    uVar4 = 0;
    do {
      cVar10 = command[lVar13 + 3];
      iVar5 = -0x57;
      if (((5 < (byte)(cVar10 + 0x9fU)) && (iVar5 = -0x37, 5 < (byte)(cVar10 + 0xbfU))) &&
         (iVar5 = -0x30, 9 < (byte)(cVar10 - 0x30U))) break;
      uVar4 = uVar4 << 4 | iVar5 + cVar10;
      lVar13 = lVar13 + 1;
    } while (lVar13 != 4);
  }
LAB_00107d7e:
  lVar13 = 0;
  uVar6 = 0;
  do {
    cVar10 = commandReply[lVar13];
    iVar5 = -0x57;
    if (((5 < (byte)(cVar10 + 0x9fU)) && (iVar5 = -0x37, 5 < (byte)(cVar10 + 0xbfU))) &&
       (iVar5 = -0x30, 9 < (byte)(cVar10 - 0x30U))) break;
    uVar6 = uVar6 << 4 | iVar5 + cVar10;
    lVar13 = lVar13 + 1;
  } while (lVar13 != 2);
  pcVar8 = commandReply;
  if ('\x1f' < *commandReply) {
    pcVar8 = commandReply + 1;
    if ('\x1f' < commandReply[1]) {
      pcVar8 = commandReply + 2;
    }
  }
  if (0 < (int)uVar6) {
    iVar5 = 0;
    do {
      lVar13 = 0;
      bVar18 = 0;
      do {
        cVar10 = pcVar8[lVar13];
        cVar9 = -0x57;
        if (((5 < (byte)(cVar10 + 0x9fU)) && (cVar9 = -0x37, 5 < (byte)(cVar10 + 0xbfU))) &&
           (cVar9 = -0x30, 9 < (byte)(cVar10 - 0x30U))) break;
        bVar18 = bVar18 << 4 | cVar9 + cVar10;
        lVar13 = lVar13 + 1;
      } while (lVar13 != 2);
      pcVar15 = pcVar8;
      if (*pcVar8 < ' ') {
LAB_00107eaf:
        pol->TxHandles[iVar5] = bVar18;
        if ((uVar4 & 1) != 0) {
          cVar10 = *pcVar15;
          if (cVar10 == 'M') {
            cVar10 = 'M';
            lVar13 = 0;
            pacVar2 = (char (*) [52])pol->TxTransforms[iVar5];
            do {
              lVar14 = lVar13;
              pacVar19 = (char (*) [52])(*pacVar2 + 1);
              (*pacVar2)[0] = cVar10;
              if ((int)lVar14 == 6) break;
              cVar10 = pcVar15[lVar14 + 1];
              lVar13 = lVar14 + 1;
              pacVar2 = pacVar19;
            } while ('\x1f' < cVar10);
LAB_00107f5f:
            pcVar15 = pcVar15 + lVar14 + 1;
          }
          else {
            if (cVar10 == 'D') {
              cVar10 = 'D';
              lVar13 = 0;
              pacVar2 = (char (*) [52])pol->TxTransforms[iVar5];
              do {
                lVar14 = lVar13;
                pacVar19 = (char (*) [52])(*pacVar2 + 1);
                (*pacVar2)[0] = cVar10;
                if ((int)lVar14 == 7) break;
                cVar10 = pcVar15[lVar14 + 1];
                lVar13 = lVar14 + 1;
                pacVar2 = pacVar19;
              } while ('\x1f' < cVar10);
              goto LAB_00107f5f;
            }
            if ('\x1f' < cVar10) {
              lVar13 = 0;
              pacVar2 = (char (*) [52])pol->TxTransforms[iVar5];
              do {
                lVar14 = lVar13;
                pacVar19 = (char (*) [52])(*pacVar2 + 1);
                (*pacVar2)[0] = cVar10;
                if ((int)lVar14 == 0x32) break;
                cVar10 = pcVar15[lVar14 + 1];
                lVar13 = lVar14 + 1;
                pacVar2 = pacVar19;
              } while ('\x1f' < cVar10);
              goto LAB_00107f5f;
            }
            pacVar19 = pol->TxTransforms + iVar5;
          }
          (*pacVar19)[0] = '\0';
          lVar13 = 0;
          do {
            if (pcVar15[lVar13] < ' ') break;
            pol->TxStatus[iVar5][lVar13] = pcVar15[lVar13];
            lVar13 = lVar13 + 1;
          } while ((int)lVar13 != 8);
          lVar14 = 0;
          do {
            if (pcVar15[lVar14 + lVar13] < ' ') break;
            pol->TxFrame[iVar5][lVar14] = pcVar15[lVar14 + lVar13];
            lVar14 = lVar14 + 1;
          } while ((int)lVar14 != 8);
          pcVar15 = pcVar15 + lVar14 + lVar13;
        }
        if ((uVar4 & 2) != 0) {
          lVar13 = 0;
          do {
            if (pcVar15[lVar13] < ' ') break;
            pol->TxInformation[iVar5][lVar13] = pcVar15[lVar13];
            lVar13 = lVar13 + 1;
          } while ((int)lVar13 != 0x14);
          pcVar15 = pcVar15 + lVar13;
        }
        if ((uVar4 & 4) != 0) {
          cVar10 = *pcVar15;
          if (cVar10 == 'M') {
            cVar10 = 'M';
            lVar13 = 0;
            pacVar3 = (char (*) [24])pol->TxSingleStray[iVar5];
            do {
              lVar14 = lVar13;
              pacVar17 = (char (*) [24])(*pacVar3 + 1);
              (*pacVar3)[0] = cVar10;
              if ((int)lVar14 == 6) break;
              cVar10 = pcVar15[lVar14 + 1];
              lVar13 = lVar14 + 1;
              pacVar3 = pacVar17;
            } while ('\x1f' < cVar10);
LAB_00108070:
            pcVar15 = pcVar15 + lVar14 + 1;
          }
          else {
            if (cVar10 == 'D') {
              cVar10 = 'D';
              lVar13 = 0;
              pacVar3 = (char (*) [24])pol->TxSingleStray[iVar5];
              do {
                lVar14 = lVar13;
                pacVar17 = (char (*) [24])(*pacVar3 + 1);
                (*pacVar3)[0] = cVar10;
                if ((int)lVar14 == 7) break;
                cVar10 = pcVar15[lVar14 + 1];
                lVar13 = lVar14 + 1;
                pacVar3 = pacVar17;
              } while ('\x1f' < cVar10);
              goto LAB_00108070;
            }
            if ('\x1f' < cVar10) {
              lVar13 = 0;
              pacVar3 = (char (*) [24])pol->TxSingleStray[iVar5];
              do {
                lVar14 = lVar13;
                pacVar17 = (char (*) [24])(*pacVar3 + 1);
                (*pacVar3)[0] = cVar10;
                if ((int)lVar14 == 0x14) break;
                cVar10 = pcVar15[lVar14 + 1];
                lVar13 = lVar14 + 1;
                pacVar3 = pacVar17;
              } while ('\x1f' < cVar10);
              goto LAB_00108070;
            }
            pacVar17 = pol->TxSingleStray + iVar5;
          }
          (*pacVar17)[0] = '\0';
        }
        pcVar15 = pcVar15 + -1;
        do {
          pcVar8 = pcVar15 + 1;
          pcVar15 = pcVar15 + 1;
        } while ('\x1f' < *pcVar8);
        pcVar8 = pcVar15 + (*pcVar8 == '\n');
        iVar5 = iVar5 + 1;
      }
      else {
        if (pcVar8[1] < ' ') {
          pcVar15 = pcVar8 + 1;
          goto LAB_00107eaf;
        }
        pcVar15 = pcVar8 + 2;
        if (*pcVar15 != 'U') goto LAB_00107eaf;
        pcVar7 = pcVar8 + 0xc;
        iVar11 = 9;
        do {
          bVar20 = iVar11 == 0;
          iVar11 = iVar11 + -1;
          pcVar8 = pcVar7;
          if (bVar20) break;
          pcVar8 = pcVar15 + 1;
          pcVar1 = pcVar15 + 1;
          pcVar15 = pcVar8;
        } while ('\x1f' < *pcVar1);
        uVar6 = uVar6 - 1;
      }
    } while (iVar5 < (int)uVar6);
  }
  pol->TxHandleCount = uVar6;
  if ((uVar4 >> 0xc & 1) != 0) {
    lVar13 = 0;
    uVar4 = 0;
    do {
      cVar10 = pcVar8[lVar13];
      iVar5 = -0x57;
      if (((5 < (byte)(cVar10 + 0x9fU)) && (iVar5 = -0x37, 5 < (byte)(cVar10 + 0xbfU))) &&
         (iVar5 = -0x30, 9 < (byte)(cVar10 - 0x30U))) break;
      uVar4 = uVar4 << 4 | iVar5 + cVar10;
      lVar13 = lVar13 + 1;
    } while (lVar13 != 2);
    if ('\x1f' < *pcVar8) {
      pcVar15 = pcVar8 + 2;
      pcVar7 = pcVar8 + 1;
      pcVar8 = pcVar8 + 1;
      if ('\x1f' < *pcVar7) {
        pcVar8 = pcVar15;
      }
    }
    uVar6 = 0x32;
    if ((int)uVar4 < 0x32) {
      uVar6 = uVar4;
    }
    pol->TxPassiveStrayCount = uVar6;
    if ((int)uVar4 < 1) {
      pcVar15 = pol->TxPassiveStray;
    }
    else {
      uVar12 = uVar6 + 3 >> 2;
      uVar16 = 1;
      if (1 < uVar12) {
        uVar16 = uVar12;
      }
      lVar13 = 0;
      do {
        if (pcVar8[lVar13] < ' ') break;
        pol->TxPassiveStrayOov[lVar13] = pcVar8[lVar13];
        lVar13 = lVar13 + 1;
      } while (uVar16 != (uint)lVar13);
      pcVar8 = pcVar8 + lVar13;
      pcVar15 = pol->TxPassiveStray;
      if (0 < (int)uVar4) {
        iVar5 = uVar6 * 0x15;
        do {
          cVar10 = *pcVar8;
          if (cVar10 < ' ') break;
          pcVar8 = pcVar8 + 1;
          *pcVar15 = cVar10;
          pcVar15 = pcVar15 + 1;
          iVar5 = iVar5 + -1;
        } while (iVar5 != 0);
      }
    }
    *pcVar15 = '\0';
  }
  lVar13 = 0;
  do {
    if (pcVar8[lVar13] < ' ') {
      return;
    }
    pol->TxSystemStatus[lVar13] = pcVar8[lVar13];
    lVar13 = lVar13 + 1;
  } while ((int)lVar13 != 4);
  return;
}

Assistant:

void ndiTXHelper(ndicapi* pol, const char* command, const char* commandReply)
  {
    unsigned long mode = NDI_XFORMS_AND_STATUS; // the default reply mode
    char* writePointer;
    int i, j, n;
    int handle, handleCount, strayCount;

    // if the TX command had a reply mode, read it
    if ((command[2] == ':' && command[7] != '\r') || (command[2] == ' ' && command[3] != '\r'))
    {
      mode = ndiHexToUnsignedLong(&command[3], 4);
    }

    // get the number of handles
    handleCount = (int)ndiHexToUnsignedLong(commandReply, 2);
    for (j = 0; j < 2 && *commandReply >= ' '; j++)
    {
      commandReply++;
    }

    // go through the information for each handle
    for (i = 0; i < handleCount; i++)
    {
      // get the handle itself (two chars)
      handle = (int)ndiHexToUnsignedLong(commandReply, 2);
      for (j = 0; j < 2 && *commandReply >= ' '; j++)
      {
        commandReply++;
      }

      // check for "UNOCCUPIED"
      if (*commandReply == 'U')
      {
        for (j = 0; j < 10 && *commandReply >= ' '; j++)
        {
          commandReply++;
        }
        // back up and continue (don't store information for unoccupied ports)
        i--;
        handleCount--;
        continue;
      }

      // save the port handle in the list
      pol->TxHandles[i] = handle;

      if (mode & NDI_XFORMS_AND_STATUS)
      {
        // get the transform, MISSING, or DISABLED
        writePointer = pol->TxTransforms[i];

        if (*commandReply == 'M')
        {
          // check for "MISSING"
          for (j = 0; j < 7 && *commandReply >= ' '; j++)
          {
            *writePointer++ = *commandReply++;
          }
        }
        else if (*commandReply == 'D')
        {
          // check for "DISABLED"
          for (j = 0; j < 8 && *commandReply >= ' '; j++)
          {
            *writePointer++ = *commandReply++;
          }
        }
        else
        {
          // read the transform
          for (j = 0; j < 51 && *commandReply >= ' '; j++)
          {
            *writePointer++ = *commandReply++;
          }
        }
        *writePointer = '\0';

        // get the status
        writePointer = pol->TxStatus[i];
        for (j = 0; j < 8 && *commandReply >= ' '; j++)
        {
          *writePointer++ = *commandReply++;
        }

        // get the frame number
        writePointer = pol->TxFrame[i];
        for (j = 0; j < 8 && *commandReply >= ' '; j++)
        {
          *writePointer++ = *commandReply++;
        }
      }

      // grab additional information
      if (mode & NDI_ADDITIONAL_INFO)
      {
        writePointer = pol->TxInformation[i];
        for (j = 0; j < 20 && *commandReply >= ' '; j++)
        {
          *writePointer++ = *commandReply++;
        }
      }

      // grab the single marker info
      if (mode & NDI_SINGLE_STRAY)
      {
        writePointer = pol->TxSingleStray[i];
        if (*commandReply == 'M')
        {
          // check for "MISSING"
          for (j = 0; j < 7 && *commandReply >= ' '; j++)
          {
            *writePointer++ = *commandReply++;
          }
        }
        else if (*commandReply == 'D')
        {
          // check for "DISABLED"
          for (j = 0; j < 8 && *commandReply >= ' '; j++)
          {
            *writePointer++ = *commandReply++;
          }
        }
        else
        {
          // read the single stray position
          for (j = 0; j < 21 && *commandReply >= ' '; j++)
          {
            *writePointer++ = *commandReply++;
          }
        }
        *writePointer = '\0';
      }

      // skip over any unsupported information
      while (*commandReply >= ' ')
      {
        commandReply++;
      }

      // eat the trailing newline
      if (*commandReply == '\n')
      {
        commandReply++;
      }
    }

    // save the number of handles (minus the unoccupied handles)
    pol->TxHandleCount = handleCount;

    // get all the passive stray information
    // this will be a maximum of 2 + ceil(numMarkers*0.5) + Y
    // where Y is
    //   0800 not used: 21 * numMarkers inside characterized measurement volume
    //   0800 used: 21 * numMarkers
    if (mode & NDI_PASSIVE_STRAY)
    {
      // get the number of strays
      strayCount = (int)ndiHexToUnsignedLong(commandReply, 2);
      for (j = 0; j < 2 && *commandReply >= ' '; j++)
      {
        commandReply++;
      }
      if (strayCount > 50)
      {
        strayCount = 50;
      }
      pol->TxPassiveStrayCount = strayCount;
      // get the out-of-volume bits
      writePointer = pol->TxPassiveStrayOov;
      n = (strayCount + 3) / 4;
      for (j = 0; j < n && *commandReply >= ' '; j++)
      {
        *writePointer++ = *commandReply++;
      }
      // get the coordinates
      writePointer = pol->TxPassiveStray;
      n = strayCount * 21;
      for (j = 0; j < n && *commandReply >= ' '; j++)
      {
        *writePointer++ = *commandReply++;
      }
      *writePointer = '\0';
    }

    // get the system status
    writePointer = pol->TxSystemStatus;
    for (j = 0; j < 4 && *commandReply >= ' '; j++)
    {
      *writePointer++ = *commandReply++;
    }
  }